

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

void __thiscall
FDDSTexture::DecompressDXT3(FDDSTexture *this,FWadLump *lump,bool premultiplied,BYTE *tcbuf)

{
  BYTE BVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  BYTE *pBVar5;
  PalEntry *local_90;
  int c;
  BYTE *tcp;
  WORD yalphaslice;
  BYTE yslice;
  WORD color16 [2];
  int i;
  int y;
  int x;
  int oy;
  int ox;
  BYTE palcol [4];
  PalEntry color [4];
  void *local_40;
  BYTE *block;
  BYTE *blockbuff;
  long blocklinelen;
  BYTE *tcbuf_local;
  bool premultiplied_local;
  FWadLump *lump_local;
  FDDSTexture *this_local;
  
  uVar3 = (ulong)(((int)((this->super_FTexture).Width + 3) >> 2) << 4);
  pvVar4 = operator_new__(uVar3);
  local_90 = (PalEntry *)&ox;
  do {
    PalEntry::PalEntry(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != color + 2);
  for (y = 0; y < (int)(uint)(this->super_FTexture).Height; y = y + 4) {
    (*(lump->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])(lump,pvVar4,uVar3);
    local_40 = pvVar4;
    for (x = 0; x < (int)(uint)(this->super_FTexture).Width; x = x + 4) {
      tcp._4_2_ = *(undefined2 *)((long)local_40 + 8);
      tcp._6_2_ = *(undefined2 *)((long)local_40 + 10);
      for (_yalphaslice = 1; -1 < _yalphaslice; _yalphaslice = _yalphaslice + -1) {
        palcol[(long)_yalphaslice * 4 + -2] =
             (byte)((ushort)*(undefined2 *)((long)&tcp + (long)_yalphaslice * 2 + 4) >> 8) & 0xf8 |
             (byte)((int)(uint)*(ushort *)((long)&tcp + (long)_yalphaslice * 2 + 4) >> 0xd);
        palcol[(long)_yalphaslice * 4 + -3] =
             (byte)((int)(*(ushort *)((long)&tcp + (long)_yalphaslice * 2 + 4) & 0x7e0) >> 3) |
             (byte)((int)(*(ushort *)((long)&tcp + (long)_yalphaslice * 2 + 4) & 0x600) >> 9);
        palcol[(long)_yalphaslice * 4 + -4] =
             (byte)((*(ushort *)((long)&tcp + (long)_yalphaslice * 2 + 4) & 0x1f) << 3) |
             (byte)((int)(*(ushort *)((long)&tcp + (long)_yalphaslice * 2 + 4) & 0x1c) >> 2);
      }
      color[0].field_0.field_0.r =
           (BYTE)((ulong)((uint)ox._2_1_ + (uint)ox._2_1_ + (uint)palcol[2] + 1) / 3);
      color[0].field_0.field_0.g =
           (BYTE)((ulong)((uint)ox._1_1_ + (uint)ox._1_1_ + (uint)palcol[1] + 1) / 3);
      color[0].field_0.field_0.b =
           (BYTE)((ulong)((uint)(byte)ox + (uint)(byte)ox + (uint)palcol[0] + 1) / 3);
      color[1].field_0.field_0.r =
           (BYTE)((ulong)((uint)ox._2_1_ + (uint)palcol[2] + (uint)palcol[2] + 1) / 3);
      color[1].field_0.field_0.g =
           (BYTE)((ulong)((uint)ox._1_1_ + (uint)palcol[1] + (uint)palcol[1] + 1) / 3);
      color[1].field_0.field_0.b =
           (BYTE)((ulong)((uint)(byte)ox + (uint)palcol[0] + (uint)palcol[0] + 1) / 3);
      if (tcbuf == (BYTE *)0x0) {
        for (_yalphaslice = 3; -1 < _yalphaslice; _yalphaslice = _yalphaslice + -1) {
          *(BYTE *)((long)&oy + (long)_yalphaslice) =
               RGB32k.All
               [(long)((int)(uint)palcol[(long)_yalphaslice * 4 + -4] >> 3) +
                (long)((int)(uint)palcol[(long)_yalphaslice * 4 + -3] >> 3) * 0x20 +
                (long)((int)(uint)palcol[(long)_yalphaslice * 4 + -2] >> 3) * 0x400];
        }
      }
      color16[0] = 0;
      color16[1] = 0;
      for (; ((int)color16 < 4 && (y + (int)color16 < (int)(uint)(this->super_FTexture).Height));
          color16 = (WORD  [2])((int)color16 + 1)) {
        tcp._3_1_ = *(byte *)((long)local_40 + (long)((int)color16 + 0xc));
        tcp._0_2_ = *(ushort *)((long)local_40 + (long)(int)color16 * 2);
        for (i = 0; (i < 4 && (x + i < (int)(uint)(this->super_FTexture).Width)); i = i + 1) {
          if (tcbuf == (BYTE *)0x0) {
            if (((int)(uint)(ushort)tcp >> ((byte)(i << 2) & 0x1f) & 0xfU) < 8) {
              *(ushort *)&(this->super_FTexture).field_0x31 =
                   *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | 8;
              BVar1 = '\0';
            }
            else {
              BVar1 = *(BYTE *)((long)&oy +
                               (long)(int)((int)(uint)tcp._3_1_ >> ((char)i * '\x02' & 0x1fU) & 3));
            }
            this->Pixels[(int)(y + (int)color16 + (x + i) * (uint)(this->super_FTexture).Height)] =
                 BVar1;
          }
          else {
            pBVar5 = tcbuf + (int)((x + i) * 4 +
                                  (y + (int)color16) * (uint)(this->super_FTexture).Width * 4);
            uVar2 = (int)(uint)tcp._3_1_ >> ((char)i * '\x02' & 0x1fU) & 3;
            *pBVar5 = palcol[(long)(int)uVar2 * 4 + -2];
            pBVar5[1] = palcol[(long)(int)uVar2 * 4 + -3];
            pBVar5[2] = palcol[(long)(int)uVar2 * 4 + -4];
            pBVar5[3] = palcol[(long)(int)uVar2 * 4 + -1];
          }
        }
      }
      local_40 = (void *)((long)local_40 + 0x10);
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

void FDDSTexture::DecompressDXT3 (FWadLump &lump, bool premultiplied, BYTE *tcbuf)
{
	const long blocklinelen = ((Width + 3) >> 2) << 4;
	BYTE *blockbuff = new BYTE[blocklinelen];
	BYTE *block;
	PalEntry color[4];
	BYTE palcol[4];
	int ox, oy, x, y, i;

	for (oy = 0; oy < Height; oy += 4)
	{
		lump.Read (blockbuff, blocklinelen);
		block = blockbuff;
		for (ox = 0; ox < Width; ox += 4)
		{
			WORD color16[2] = { LittleShort(((WORD *)block)[4]), LittleShort(((WORD *)block)[5]) };

			// Convert color from R5G6B5 to R8G8B8.
			for (i = 1; i >= 0; --i)
			{
				color[i].r = ((color16[i] & 0xF800) >> 8) | (color16[i] >> 13);
				color[i].g = ((color16[i] & 0x07E0) >> 3) | ((color16[i] & 0x0600) >> 9);
				color[i].b = ((color16[i] & 0x001F) << 3) | ((color16[i] & 0x001C) >> 2);
			}
			// Derive the other two colors.
			color[2].r = (color[0].r + color[0].r + color[1].r + 1) / 3;
			color[2].g = (color[0].g + color[0].g + color[1].g + 1) / 3;
			color[2].b = (color[0].b + color[0].b + color[1].b + 1) / 3;

			color[3].r = (color[0].r + color[1].r + color[1].r + 1) / 3;
			color[3].g = (color[0].g + color[1].g + color[1].g + 1) / 3;
			color[3].b = (color[0].b + color[1].b + color[1].b + 1) / 3;

			// Pick colors from the palette for each of the four colors.
			if (!tcbuf) for (i = 3; i >= 0; --i)
			{
				palcol[i] = RGB32k.RGB[color[i].r >> 3][color[i].g >> 3][color[i].b >> 3];
			}
			// Now decode this 4x4 block to the pixel buffer.
			for (y = 0; y < 4; ++y)
			{
				if (oy + y >= Height)
				{
					break;
				}
				BYTE yslice = block[12 + y];
				WORD yalphaslice = LittleShort(((WORD *)block)[y]);
				for (x = 0; x < 4; ++x)
				{
					if (ox + x >= Width)
					{
						break;
					}
					if (!tcbuf)
					{
						Pixels[oy + y + (ox + x) * Height] = ((yalphaslice >> (x*4)) & 15) < 8 ?
							(bMasked = true, 0) : palcol[(yslice >> (x + x)) & 3];
					}
					else
					{
						BYTE * tcp = &tcbuf[(ox + x)*4 + (oy + y) * Width*4];
						int c = (yslice >> (x + x)) & 3;
						tcp[0] = color[c].r;
						tcp[1] = color[c].g;
						tcp[2] = color[c].b;
						tcp[3] = color[c].a;
					}
				}
			}
			block += 16;
		}
	}
	delete[] blockbuff;
}